

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Times<1,_0,_1>::propagate(Times<1,_0,_1> *this)

{
  int iVar1;
  IntVar *pIVar2;
  IntVar *pIVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  pIVar2 = (this->x).var;
  pIVar3 = (this->y).var;
  iVar9 = (pIVar2->max).v;
  lVar15 = -(long)iVar9;
  iVar8 = (pIVar2->min).v;
  iVar7 = (pIVar3->min).v;
  iVar6 = (pIVar3->max).v;
  lVar12 = (long)iVar6;
  pIVar3 = (this->z).var;
  lVar13 = (long)(pIVar3->max).v;
  lVar14 = -lVar13;
  iVar1 = (pIVar3->min).v;
  lVar16 = iVar7 * lVar15;
  lVar13 = lVar16 + lVar13;
  if (lVar13 != 0 && SBORROW8(lVar16,lVar14) == lVar13 < 0) {
    if (so.lazy) {
      iVar4 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar11 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar2 = (this->z).var;
    iVar4 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xf])(pIVar2,-lVar16,uVar11,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  lVar13 = -(long)iVar8;
  lVar16 = lVar12 * lVar13;
  if ((lVar16 < 500000000) &&
     (lVar10 = (long)(((this->z).var)->min).v, SBORROW8(lVar16,-lVar10) != lVar16 + lVar10 < 0)) {
    if (so.lazy == true) {
      iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar11 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar2 = (this->z).var;
    iVar4 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])(pIVar2,-lVar16,uVar11,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  if ((0 < iVar6) &&
     (lVar12 = (lVar12 + lVar14 + -1) / lVar12, lVar16 = (long)(((this->x).var)->max).v,
     lVar10 = -lVar16, lVar12 != lVar10 && SBORROW8(lVar12,lVar10) == lVar12 + lVar16 < 0)) {
    if (so.lazy == true) {
      iVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar11 = (ulong)uVar5 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar2 = (this->x).var;
    iVar6 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xf])(pIVar2,-lVar12,uVar11,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  lVar12 = -(long)iVar1;
  if ((0 < iVar7) &&
     (lVar16 = lVar12 / (long)iVar7, lVar10 = (long)(((this->x).var)->min).v,
     SBORROW8(lVar16,-lVar10) != lVar16 + lVar10 < 0)) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar11 = (ulong)uVar5 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar2 = (this->x).var;
    iVar7 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])(pIVar2,-lVar16,uVar11,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if ((iVar8 < 0) && (lVar13 = (lVar13 + lVar14 + -1) / lVar13, (((this->y).var)->min).v < lVar13))
  {
    if (so.lazy == true) {
      iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar11 = (ulong)uVar5 << 0x20 | (long)iVar8 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar2 = (this->y).var;
    iVar8 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])(pIVar2,lVar13,uVar11,1);
    if ((char)iVar8 == '\0') {
      return false;
    }
  }
  if (-1 < iVar9) {
    return true;
  }
  lVar12 = lVar12 / lVar15;
  if (lVar12 < (((this->y).var)->max).v) {
    if (so.lazy == true) {
      iVar9 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar11 = (ulong)uVar5 << 0x20 | (long)iVar9 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar2 = (this->y).var;
    iVar9 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xf])(pIVar2,lVar12,uVar11,1);
    if ((char)iVar9 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= x.min * y.min
		setDom(z, setMin, x_min * y_min, x.getMinLit(), y.getMinLit());
		// z <= x.max * y.max
		if (x_max * y_max < IntVar::max_limit) {
			setDom(z, setMax, x_max * y_max, x.getMaxLit(), y.getMaxLit());
		}

		// x >= ceil(z.min / y.max)
		if (y_max >= 1) {
			setDom(x, setMin, (z_min + y_max - 1) / y_max, y.getMaxLit(), z.getMinLit());
		}

		// x <= floor(z.max / y.min)
		if (y_min >= 1) {
			setDom(x, setMax, z_max / y_min, y.getMinLit(), z.getMaxLit());
		}

		// y >= ceil(z.min / x.max)
		if (x_max >= 1) {
			setDom(y, setMin, (z_min + x_max - 1) / x_max, x.getMaxLit(), z.getMinLit());
		}

		// y <= floor(z.max / x.min)
		if (x_min >= 1) {
			setDom(y, setMax, z_max / x_min, x.getMinLit(), z.getMaxLit());
		}

		return true;
	}